

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute.c
# Opt level: O1

int flute_wl(int d,int *x,int *y,int acc)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int *piVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  point *ptp [150];
  int s [150];
  int ys [150];
  int xs [150];
  point pt [150];
  long local_12f8 [150];
  int local_e48 [152];
  int local_be8 [152];
  int local_988 [152];
  int local_728 [450];
  
  if (d == 2) {
    iVar7 = *x - x[1];
    iVar8 = -iVar7;
    if (0 < iVar7) {
      iVar8 = iVar7;
    }
    iVar12 = *y - y[1];
    iVar7 = -iVar12;
    if (0 < iVar12) {
      iVar7 = iVar12;
    }
    return iVar7 + iVar8;
  }
  if (d == 3) {
    iVar8 = *x;
    iVar7 = x[1];
    iVar12 = iVar7;
    if (iVar7 < iVar8) {
      iVar12 = iVar8;
    }
    if (iVar8 < iVar7) {
      iVar7 = iVar8;
    }
    iVar8 = x[2];
    if (iVar12 <= iVar8) {
      iVar12 = iVar8;
    }
    if (iVar8 <= iVar7) {
      iVar7 = iVar8;
    }
    iVar8 = *y;
    iVar2 = y[1];
    iVar5 = iVar2;
    if (iVar2 < iVar8) {
      iVar5 = iVar8;
    }
    if (iVar8 < iVar2) {
      iVar2 = iVar8;
    }
    iVar8 = y[2];
    if (iVar5 <= iVar8) {
      iVar5 = iVar8;
    }
    if (iVar8 <= iVar2) {
      iVar2 = iVar8;
    }
    return (iVar5 + iVar12) - (iVar2 + iVar7);
  }
  uVar6 = (ulong)(uint)d;
  if (0 < d) {
    piVar10 = local_728;
    uVar14 = 0;
    do {
      *piVar10 = x[uVar14];
      piVar10[1] = y[uVar14];
      local_12f8[uVar14] = (long)piVar10;
      uVar14 = uVar14 + 1;
      piVar10 = piVar10 + 3;
    } while (uVar6 != uVar14);
  }
  uVar9 = d - 1;
  if (1 < d) {
    uVar13 = 1;
    uVar14 = 0;
    do {
      piVar10 = (int *)local_12f8[uVar14];
      uVar1 = uVar14 + 1;
      iVar8 = *piVar10;
      uVar11 = uVar14 & 0xffffffff;
      uVar15 = uVar13;
      do {
        iVar7 = *(int *)local_12f8[uVar15];
        if (iVar7 < iVar8) {
          uVar11 = uVar15 & 0xffffffff;
        }
        if (iVar7 <= iVar8) {
          iVar8 = iVar7;
        }
        uVar15 = uVar15 + 1;
      } while (uVar6 != uVar15);
      local_12f8[uVar14] = local_12f8[(int)uVar11];
      local_12f8[(int)uVar11] = (long)piVar10;
      uVar13 = uVar13 + 1;
      uVar14 = uVar1;
    } while (uVar1 != uVar9);
  }
  if (0 < d) {
    uVar14 = 0;
    do {
      piVar10 = (int *)local_12f8[uVar14];
      local_988[uVar14] = *piVar10;
      piVar10[2] = (int)uVar14;
      uVar14 = uVar14 + 1;
    } while (uVar6 != uVar14);
  }
  if (1 < d) {
    uVar13 = 1;
    uVar14 = 0;
    do {
      lVar3 = local_12f8[uVar14];
      uVar1 = uVar14 + 1;
      iVar8 = *(int *)(lVar3 + 4);
      uVar11 = uVar14 & 0xffffffff;
      uVar15 = uVar13;
      do {
        iVar7 = *(int *)(local_12f8[uVar15] + 4);
        if (iVar7 < iVar8) {
          uVar11 = uVar15 & 0xffffffff;
        }
        if (iVar7 <= iVar8) {
          iVar8 = iVar7;
        }
        uVar15 = uVar15 + 1;
      } while (uVar6 != uVar15);
      lVar4 = local_12f8[(int)uVar11];
      local_be8[uVar14] = *(int *)(lVar4 + 4);
      local_e48[uVar14] = *(int *)(lVar4 + 8);
      local_12f8[(int)uVar11] = lVar3;
      uVar13 = uVar13 + 1;
      uVar14 = uVar1;
    } while (uVar1 != uVar9);
  }
  lVar3 = local_12f8[(int)uVar9];
  local_be8[(int)uVar9] = *(int *)(lVar3 + 4);
  local_e48[(int)uVar9] = *(int *)(lVar3 + 8);
  if (d < 10) {
    iVar8 = flutes_wl_LD(d,local_988,local_be8,local_e48);
  }
  else {
    iVar8 = flutes_wl_MD(d,local_988,local_be8,local_e48,acc);
  }
  return iVar8;
}

Assistant:

DTYPE flute_wl(int d, DTYPE x[], DTYPE y[], int acc)
{
    DTYPE xs[MAXD], ys[MAXD], minval, l, xu, xl, yu, yl;
    int s[MAXD];
    int i, j, k, minidx;
    struct point pt[MAXD], *ptp[MAXD], *tmpp;

    if (d==2)
        l = ADIFF(x[0], x[1]) + ADIFF(y[0], y[1]);
    else if (d==3) {
        if (x[0] > x[1]) {
            xu = max(x[0], x[2]);
            xl = min(x[1], x[2]);
        }
        else {
            xu = max(x[1], x[2]);
            xl = min(x[0], x[2]);
        }
        if (y[0] > y[1]) {
            yu = max(y[0], y[2]);
            yl = min(y[1], y[2]);
        }
        else {
            yu = max(y[1], y[2]);
            yl = min(y[0], y[2]);
        }
        l = (xu-xl) + (yu-yl);
    }
    else {
        for (i=0; i<d; i++) {
            pt[i].x = x[i];
            pt[i].y = y[i];
            ptp[i] = &pt[i];
        }
        
        // sort x
        for (i=0; i<d-1; i++) {
            minval = ptp[i]->x;
            minidx = i;
            for (j=i+1; j<d; j++) {
                if (minval > ptp[j]->x) {
                    minval = ptp[j]->x;
                    minidx = j;
                }
            }
            tmpp = ptp[i];
            ptp[i] = ptp[minidx];
            ptp[minidx] = tmpp;
        }

#if REMOVE_DUPLICATE_PIN==1
        ptp[d] = &pt[d];
        ptp[d]->x = ptp[d]->y = -999999;
        j = 0;
        for (i=0; i<d; i++) {
            for (k=i+1; ptp[k]->x == ptp[i]->x; k++)
                if (ptp[k]->y == ptp[i]->y)  // pins k and i are the same
                    break;
            if (ptp[k]->x != ptp[i]->x)
                ptp[j++] = ptp[i];
        }
        d = j;
#endif
        
        for (i=0; i<d; i++) {
            xs[i] = ptp[i]->x;
            ptp[i]->o = i;
        }

        // sort y to find s[]
        for (i=0; i<d-1; i++) {
            minval = ptp[i]->y;
            minidx = i;
            for (j=i+1; j<d; j++) {
                if (minval > ptp[j]->y) {
                    minval = ptp[j]->y;
                    minidx = j;
                }
            }
            ys[i] = ptp[minidx]->y;
            s[i] = ptp[minidx]->o;
            ptp[minidx] = ptp[i];
        }
        ys[d-1] = ptp[d-1]->y;
        s[d-1] = ptp[d-1]->o;
        
        l = flutes_wl(d, xs, ys, s, acc);
    }
    return l;
}